

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simulator.cpp
# Opt level: O3

void __thiscall Simulator::printStatistics(Simulator *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 in_XMM2 [16];
  string local_30;
  
  puts("-------STATISTICS---------");
  printf("Number of Cycles: %u\n",(ulong)(this->history).cycle_count);
  printf("Number of Instructions: %u\n",(ulong)(this->history).inst_count);
  uVar1 = (this->history).inst_count;
  uVar2 = (this->history).cycle_count;
  auVar4._4_4_ = uVar2;
  auVar4._0_4_ = uVar1;
  auVar4._8_8_ = 0;
  auVar3 = vcvtudq2ps_avx512vl(auVar4);
  auVar4 = vmovshdup_avx(auVar3);
  printf("Avg Cycles per Instrcution: %.4f\n",(double)(auVar4._0_4_ / auVar3._0_4_));
  printf("Number of JALR Instructions: %u\n",(ulong)(this->history).jalr_count);
  printf("Number of JAL Instructions: %u\n",(ulong)(this->history).jal_count);
  printf("Number of LOAD Instructions: %u\n",(ulong)(this->history).load_count);
  printf("Number of STORE Instructions: %u\n",(ulong)(this->history).store_count);
  printf("Number of BRANCH Instructions: %u\n",(ulong)(this->history).branch_count);
  printf("Number of Successful Prediction: %u\n",(ulong)(this->history).predicted_success);
  printf("Number of Unsuccessful Prediction: %u\n",(ulong)(this->history).predicted_unsuccess);
  auVar4 = vcvtusi2ss_avx512f(in_XMM2,(this->history).predicted_success);
  auVar3 = vcvtusi2ss_avx512f(in_XMM2,(this->history).branch_count);
  BranchPredictor::getStrategyName_abi_cxx11_(&local_30,this->branch_predictor);
  printf("Branch Prediction Accuracy: %.4f (Using Strategy: %s)\n",
         (double)(auVar4._0_4_ / auVar3._0_4_),local_30._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  printf("Number of Control Hazards: %u\n",(ulong)(this->history).control_hazard_count);
  printf("Number of Data Hazards: %u\n",(ulong)(this->history).data_hazard_count);
  printf("Number of Structural Hazards: %u\n",(ulong)(this->history).structural_hazard_count);
  puts("-----------------------------------");
  return;
}

Assistant:

void Simulator::printStatistics() const {
    printf("-------STATISTICS---------\n");
    printf("Number of Cycles: %u\n", history.cycle_count);
    printf("Number of Instructions: %u\n", history.inst_count);
    printf("Avg Cycles per Instrcution: %.4f\n", (float) history.cycle_count / history.inst_count);
    printf("Number of JALR Instructions: %u\n", history.jalr_count);
    printf("Number of JAL Instructions: %u\n", history.jal_count);
    printf("Number of LOAD Instructions: %u\n", history.load_count);
    printf("Number of STORE Instructions: %u\n", history.store_count);
    printf("Number of BRANCH Instructions: %u\n", history.branch_count);
    printf("Number of Successful Prediction: %u\n", history.predicted_success);
    printf("Number of Unsuccessful Prediction: %u\n", history.predicted_unsuccess);
    printf("Branch Prediction Accuracy: %.4f (Using Strategy: %s)\n",
           (float) history.predicted_success / history.branch_count,
           branch_predictor->getStrategyName().c_str());
    printf("Number of Control Hazards: %u\n", this->history.control_hazard_count);
    printf("Number of Data Hazards: %u\n", this->history.data_hazard_count);
    printf("Number of Structural Hazards: %u\n", this->history.structural_hazard_count);
    printf("-----------------------------------\n");
}